

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O3

bool __thiscall gmlc::networking::TcpAcceptor::start(TcpAcceptor *this,pointer *conn)

{
  element_type *peVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  int __n;
  int __fd;
  ulong uVar4;
  shared_ptr<gmlc::networking::TcpAcceptor> ptr;
  string local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  size_type local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if ((conn->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      == (element_type *)0x0) {
    if (((this->accepting).activated._M_base._M_i & 1U) != 0) {
      concurrency::TriggerVariable::trigger(&this->accepting);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"tcpconnection is not valid","");
    logger(this,0,&local_b0);
  }
  else {
    if ((this->state)._M_i == CONNECTED) {
      bVar3 = concurrency::TriggerVariable::activate(&this->accepting);
      if (!bVar3) {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"acceptor is already active","");
        __fd = 1;
        logger(this,1,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          uVar4 = local_b0.field_2._M_allocated_capacity + 1;
          operator_delete(local_b0._M_dataplus._M_p,uVar4);
          __fd = (int)uVar4;
        }
        TcpConnection::close
                  ((conn->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,__fd);
        return false;
      }
      peVar1 = (conn->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      peVar2 = (peVar1->socket_).
               super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (peVar1->socket_).
                super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::listen
                (&this->acceptor_,0x1000,__n);
      std::__shared_ptr<gmlc::networking::TcpAcceptor,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<gmlc::networking::TcpAcceptor,void>
                ((__shared_ptr<gmlc::networking::TcpAcceptor,(__gnu_cxx::_Lock_policy)2> *)&local_88
                 ,(__weak_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2> *)this);
      local_48 = local_88;
      uStack_40 = (size_type)p_Stack_80;
      local_b0._M_string_length = local_88;
      local_b0.field_2._M_allocated_capacity = (size_type)p_Stack_80;
      local_88 = 0;
      p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b0.field_2._8_8_ =
           (conn->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      p_Stack_90 = (conn->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
      (conn->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (conn->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
           = (element_type *)0x0;
      local_68 = (code *)0x0;
      pcStack_60 = (code *)0x0;
      local_78 = (undefined8 *)0x0;
      uStack_70 = 0;
      local_b0._M_dataplus._M_p = (pointer)this;
      local_58 = (element_type *)local_b0.field_2._8_8_;
      p_Stack_50 = p_Stack_90;
      local_78 = (undefined8 *)operator_new(0x28);
      *local_78 = this;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_allocated_capacity = 0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_78[3] = local_58;
      local_78[4] = p_Stack_50;
      *(undefined4 *)(local_78 + 1) = (undefined4)local_48;
      *(undefined4 *)((long)local_78 + 0xc) = local_48._4_4_;
      *(undefined4 *)(local_78 + 2) = (undefined4)uStack_40;
      *(undefined4 *)((long)local_78 + 0x14) = uStack_40._4_4_;
      local_b0.field_2._8_8_ = 0;
      pcStack_60 = std::
                   _Function_handler<void_(const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpAcceptor.cpp:103:13)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(const_std::error_code_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/ThirdParty/networking/gmlc/networking/TcpAcceptor.cpp:103:13)>
                 ::_M_manager;
      (*peVar2->_vptr_Socket[7])(peVar2,&this->acceptor_);
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        return true;
      }
      return true;
    }
    TcpConnection::close
              ((conn->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(int)conn);
    if (((this->accepting).activated._M_base._M_i & 1U) != 0) {
      concurrency::TriggerVariable::trigger(&this->accepting);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"acceptor is not in a connected state","");
    logger(this,1,&local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool TcpAcceptor::start(TcpConnection::pointer conn)
{
    if (!conn) {
        if (accepting.isActive()) {
            accepting.trigger();
        }
        logger(0, "tcpconnection is not valid");
        return false;
    }
    if (state != AcceptingStates::CONNECTED) {
        conn->close();
        if (accepting.isActive()) {
            accepting.trigger();
        }
        logger(1, "acceptor is not in a connected state");
        return false;
    }
    if (accepting.activate()) {
        auto socket = conn->socket();
        acceptor_.listen();
        auto ptr = shared_from_this();
        socket->use_with_acceptor(
            acceptor_,
            [this, apointer = std::move(ptr), connection = std::move(conn)](
                const std::error_code& error) {
                handle_accept(apointer, connection, error);
            });
        return true;
    }

    logger(1, "acceptor is already active");
    conn->close();
    return false;
}